

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo_unix.cpp
# Opt level: O3

QHostInfo __thiscall QHostInfoAgent::fromName(QHostInfoAgent *this,QString *hostName)

{
  bool bVar1;
  long in_FS_OFFSET;
  QHostAddress address;
  QHostInfo results;
  QHostAddress local_38;
  QHostInfo local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.d_ptr = (QHostInfoPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QHostInfo::QHostInfo(&local_30,-1);
  local_38.d.d.ptr = (QExplicitlySharedDataPointer<QHostAddressPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QHostAddress::QHostAddress(&local_38);
  bVar1 = QHostAddress::setAddress(&local_38,hostName);
  if (bVar1) {
    reverseLookup(this,&local_38);
  }
  else {
    lookup(this,hostName);
  }
  QHostAddress::~QHostAddress(&local_38);
  QHostInfo::~QHostInfo(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QHostInfo)(QHostInfoPrivate *)this;
  }
  __stack_chk_fail();
}

Assistant:

QHostInfo QHostInfoAgent::fromName(const QString &hostName)
{
    QHostInfo results;

#if defined(QHOSTINFO_DEBUG)
    qDebug("QHostInfoAgent::fromName(%s) looking up...",
           hostName.toLatin1().constData());
#endif

    maybeRefreshResolver();

    QHostAddress address;
    if (address.setAddress(hostName))
        return reverseLookup(address);

    return lookup(hostName);
}